

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_frame_codec.c
# Opt level: O1

int amqp_frame_codec_encode_frame
              (AMQP_FRAME_CODEC_HANDLE amqp_frame_codec,uint16_t channel,AMQP_VALUE performative,
              PAYLOAD *payloads,size_t payload_count,ON_BYTES_ENCODED on_bytes_encoded,
              void *callback_context)

{
  int iVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  AMQP_VALUE value;
  uchar *__ptr;
  ulong uVar4;
  PAYLOAD *payloads_00;
  size_t payload_count_00;
  ulong __size;
  char *pcVar5;
  uchar channel_bytes [2];
  size_t encoded_size;
  uint64_t performative_ulong;
  
  if ((performative == (AMQP_VALUE)0x0 || amqp_frame_codec == (AMQP_FRAME_CODEC_HANDLE)0x0) ||
      on_bytes_encoded == (ON_BYTES_ENCODED)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0xe8;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0xe8;
    }
    iVar2 = 0xe7;
LAB_00128ce7:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_frame_codec.c"
              ,"amqp_frame_codec_encode_frame",iVar2,1,
              "Bad arguments: amqp_frame_codec = %p, performative = %p, on_bytes_encoded = %p",
              amqp_frame_codec,performative,on_bytes_encoded);
    return iVar1;
  }
  value = amqpvalue_get_inplace_descriptor(performative);
  if (value == (AMQP_VALUE)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0xf4;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0xf4;
    }
    pcVar5 = "Getting the descriptor failed";
    iVar2 = 0xf3;
LAB_00128d82:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_frame_codec.c"
              ,"amqp_frame_codec_encode_frame",iVar2,1,pcVar5);
    return iVar1;
  }
  iVar1 = amqpvalue_get_ulong(value,&performative_ulong);
  if (iVar1 != 0) {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0xfa;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0xfa;
    }
    pcVar5 = "Getting the descriptor ulong failed";
    iVar2 = 0xf9;
    goto LAB_00128d82;
  }
  if (performative_ulong - 0x19 < 0xfffffffffffffff7) {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0x103;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x103;
    }
    iVar2 = 0x102;
    goto LAB_00128ce7;
  }
  iVar1 = amqpvalue_get_encoded_size(performative,&encoded_size);
  if (iVar1 != 0) {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0x10a;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x10a;
    }
    pcVar5 = "Getting the encoded size failed";
    iVar2 = 0x109;
    goto LAB_00128d82;
  }
  __ptr = (uchar *)malloc(encoded_size);
  if (__ptr == (uchar *)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0x112;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x112;
    }
    pcVar5 = "Could not allocate performative bytes";
    iVar2 = 0x111;
    goto LAB_00128d82;
  }
  payload_count_00 = payload_count + 1;
  uVar4 = 0xffffffffffffffff;
  if (payload_count_00 != 0) {
    uVar4 = payload_count_00;
  }
  __size = -(ulong)(uVar4 >> 0x3c != 0) | uVar4 << 4;
  if ((uVar4 >> 0x3c != 0) ||
     (payloads_00 = (PAYLOAD *)calloc(1,__size), payloads_00 == (PAYLOAD *)0x0)) {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0x11d;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_frame_codec.c"
                ,"amqp_frame_codec_encode_frame",0x11c,1,
                "Could not allocate frame payloads, size:%zu",__size);
    }
    goto LAB_00129027;
  }
  payloads_00->bytes = __ptr;
  payloads_00->length = 0;
  if (payload_count != 0) {
    memcpy(payloads_00 + 1,payloads,payload_count << 4);
  }
  iVar1 = amqpvalue_encode(performative,encode_bytes,payloads_00);
  if (iVar1 == 0) {
    channel_bytes = (uchar  [2])(channel << 8 | channel >> 8);
    iVar1 = 0;
    iVar2 = frame_codec_encode_frame
                      (amqp_frame_codec->frame_codec,'\0',payloads_00,payload_count_00,channel_bytes
                       ,2,on_bytes_encoded,callback_context);
    if (iVar2 != 0) {
      p_Var3 = xlogging_get_log_function();
      iVar1 = 0x13e;
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar5 = "frame_codec_encode_frame failed";
        iVar2 = 0x13d;
        goto LAB_00129012;
      }
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0x12e;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar5 = "amqpvalue_encode failed";
      iVar2 = 0x12d;
LAB_00129012:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_frame_codec.c"
                ,"amqp_frame_codec_encode_frame",iVar2,1,pcVar5);
    }
  }
  free(payloads_00);
LAB_00129027:
  free(__ptr);
  return iVar1;
}

Assistant:

int amqp_frame_codec_encode_frame(AMQP_FRAME_CODEC_HANDLE amqp_frame_codec, uint16_t channel, AMQP_VALUE performative, const PAYLOAD* payloads, size_t payload_count, ON_BYTES_ENCODED on_bytes_encoded, void* callback_context)
{
    int result;

    /* Codes_SRS_AMQP_FRAME_CODEC_01_024: [If frame_codec, performative or on_bytes_encoded is NULL, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
    if ((amqp_frame_codec == NULL) ||
        (performative == NULL) ||
        (on_bytes_encoded == NULL))
    {
        LogError("Bad arguments: amqp_frame_codec = %p, performative = %p, on_bytes_encoded = %p",
            amqp_frame_codec, performative, on_bytes_encoded);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE descriptor;
        uint64_t performative_ulong;
        size_t encoded_size;

        if ((descriptor = amqpvalue_get_inplace_descriptor(performative)) == NULL)
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_029: [If any error occurs during encoding, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Getting the descriptor failed");
            result = MU_FAILURE;
        }
        else if (amqpvalue_get_ulong(descriptor, &performative_ulong) != 0)
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_029: [If any error occurs during encoding, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Getting the descriptor ulong failed");
            result = MU_FAILURE;
        }
        /* Codes_SRS_AMQP_FRAME_CODEC_01_008: [The performative MUST be one of those defined in section 2.7 and is encoded as a described type in the AMQP type system.] */
        else if ((performative_ulong < AMQP_OPEN) ||
            (performative_ulong > AMQP_CLOSE))
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_029: [If any error occurs during encoding, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Bad arguments: amqp_frame_codec = %p, performative = %p, on_bytes_encoded = %p",
                amqp_frame_codec, performative, on_bytes_encoded);
            result = MU_FAILURE;
        }
        /* Codes_SRS_AMQP_FRAME_CODEC_01_027: [The encoded size of the performative and its fields shall be obtained by calling amqpvalue_get_encoded_size.] */
        else if (amqpvalue_get_encoded_size(performative, &encoded_size) != 0)
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_029: [If any error occurs during encoding, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Getting the encoded size failed");
            result = MU_FAILURE;
        }
        else
        {
            unsigned char* amqp_performative_bytes = (unsigned char*)malloc(encoded_size);
            if (amqp_performative_bytes == NULL)
            {
                LogError("Could not allocate performative bytes");
                result = MU_FAILURE;
            }
            else
            {
                PAYLOAD* new_payloads;
                size_t calloc_size = safe_add_size_t(payload_count, 1);
                calloc_size = safe_multiply_size_t(calloc_size, sizeof(PAYLOAD));
                if (calloc_size == SIZE_MAX ||
                    (new_payloads = (PAYLOAD*)calloc(1, calloc_size)) == NULL)
                {
                    LogError("Could not allocate frame payloads, size:%zu", calloc_size);
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_AMQP_FRAME_CODEC_01_070: [The payloads argument for frame_codec_encode_frame shall be made of the payload for the encoded performative and the payloads passed to amqp_frame_codec_encode_frame.] */
                    /* Codes_SRS_AMQP_FRAME_CODEC_01_028: [The encode result for the performative shall be placed in a PAYLOAD structure.] */
                    new_payloads[0].bytes = amqp_performative_bytes;
                    new_payloads[0].length = 0;

                    if (payload_count > 0)
                    {
                        (void)memcpy(new_payloads + 1, payloads, sizeof(PAYLOAD) * payload_count);
                    }

                    if (amqpvalue_encode(performative, encode_bytes, &new_payloads[0]) != 0)
                    {
                        LogError("amqpvalue_encode failed");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        unsigned char channel_bytes[2];

                        channel_bytes[0] = channel >> 8;
                        channel_bytes[1] = channel & 0xFF;

                        /* Codes_SRS_AMQP_FRAME_CODEC_01_005: [Bytes 6 and 7 of an AMQP frame contain the channel number ] */
                        /* Codes_SRS_AMQP_FRAME_CODEC_01_025: [amqp_frame_codec_encode_frame shall encode the frame header by using frame_codec_encode_frame.] */
                        /* Codes_SRS_AMQP_FRAME_CODEC_01_006: [The frame body is defined as a performative followed by an opaque payload.] */
                        if (frame_codec_encode_frame(amqp_frame_codec->frame_codec, FRAME_TYPE_AMQP, new_payloads, payload_count + 1, channel_bytes, sizeof(channel_bytes), on_bytes_encoded, callback_context) != 0)
                        {
                            /* Codes_SRS_AMQP_FRAME_CODEC_01_029: [If any error occurs during encoding, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
                            LogError("frame_codec_encode_frame failed");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            /* Codes_SRS_AMQP_FRAME_CODEC_01_022: [amqp_frame_codec_begin_encode_frame shall encode the frame header and AMQP performative in an AMQP frame and on success it shall return 0.] */
                            result = 0;
                        }
                    }

                    free(new_payloads);
                }

                free(amqp_performative_bytes);
            }
        }
    }

    return result;
}